

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  int *piVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImGuiInputEvent *pIVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ImGuiInputEvent *pIVar9;
  bool *pbVar10;
  int iVar11;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  if (this->AppAcceptingEvents == true) {
    uVar4 = (GImGui->InputEventsQueue).Size;
    uVar6 = uVar4;
    do {
      if ((int)uVar6 < 1) {
LAB_001db9c1:
        pIVar9 = (ImGuiInputEvent *)0x0;
        break;
      }
      uVar8 = (ulong)uVar6;
      pIVar5 = (GImGui->InputEventsQueue).Data + uVar6;
      while (pIVar9 = pIVar5 + -1, pIVar9->Type != ImGuiInputEventType_MouseButton) {
        bVar2 = uVar8 < 2;
        uVar8 = uVar8 - 1;
        pIVar5 = pIVar9;
        if (bVar2) goto LAB_001db9c1;
      }
      uVar6 = (int)uVar8 - 1;
    } while (pIVar5[-1].field_2.MouseButton.Button != mouse_button);
    pbVar10 = (GImGui->IO).MouseDown + mouse_button;
    if (pIVar9 != (ImGuiInputEvent *)0x0) {
      pbVar10 = &(pIVar9->field_2).MouseButton.Down;
    }
    if (*pbVar10 != down) {
      if (uVar4 == (GImGui->InputEventsQueue).Capacity) {
        if (uVar4 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = (int)uVar4 / 2 + uVar4;
        }
        iVar11 = uVar4 + 1;
        if ((int)(uVar4 + 1) < iVar7) {
          iVar11 = iVar7;
        }
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
        pIVar5 = (ImGuiInputEvent *)
                 (*GImAllocatorAllocFunc)((long)iVar11 * 0x18,GImAllocatorUserData);
        pIVar9 = (pIVar3->InputEventsQueue).Data;
        if (pIVar9 != (ImGuiInputEvent *)0x0) {
          memcpy(pIVar5,pIVar9,(long)(pIVar3->InputEventsQueue).Size * 0x18);
          pIVar9 = (pIVar3->InputEventsQueue).Data;
          if ((pIVar9 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
        }
        (pIVar3->InputEventsQueue).Data = pIVar5;
        (pIVar3->InputEventsQueue).Capacity = iVar11;
        uVar4 = (pIVar3->InputEventsQueue).Size;
      }
      else {
        pIVar5 = (GImGui->InputEventsQueue).Data;
      }
      pIVar5[(int)uVar4].Type = ImGuiInputEventType_MouseButton;
      pIVar5[(int)uVar4].Source = ImGuiInputSource_Mouse;
      pIVar5[(int)uVar4].field_2.MouseButton.Button = mouse_button;
      pIVar5[(int)uVar4].field_2.MouseButton.Down = down;
      *(undefined8 *)((long)&pIVar5[(int)uVar4].field_2 + 5) = 0;
      *(undefined4 *)&pIVar5[(int)uVar4].AddedByTestEngine = 0;
      (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
    if (!AppAcceptingEvents)
        return;

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MouseButton, (int)mouse_button);
    const bool latest_button_down = latest_event ? latest_event->MouseButton.Down : g.IO.MouseDown[mouse_button];
    if (latest_button_down == down)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}